

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

size_t put_uint(MIR_context_t ctx,writer_func_t writer,uint64_t u,int nb)

{
  undefined4 local_30;
  int n;
  int nb_local;
  uint64_t u_local;
  writer_func_t writer_local;
  MIR_context_t ctx_local;
  
  if (writer == (writer_func_t)0x0) {
    ctx_local = (MIR_context_t)0x0;
  }
  else {
    _n = u;
    for (local_30 = 0; local_30 < nb; local_30 = local_30 + 1) {
      put_byte(ctx,writer,(uint)_n & 0xff);
      _n = _n >> 8;
    }
    ctx_local = (MIR_context_t)(long)nb;
  }
  return (size_t)ctx_local;
}

Assistant:

static size_t put_uint (MIR_context_t ctx, writer_func_t writer, uint64_t u, int nb) {
  if (writer == NULL) return 0;
  for (int n = 0; n < nb; n++) {
    put_byte (ctx, writer, u & 0xff);
    u >>= CHAR_BIT;
  }
  return nb;
}